

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::anon_unknown_14::reportFatal(string *message)

{
  IReporter *pIVar1;
  bool bVar2;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *pvVar3;
  char *in;
  size_type sVar4;
  reference ppIVar5;
  IReporter **curr_rep_3;
  iterator __end2_2;
  iterator __begin2_2;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range2_2;
  IReporter **curr_rep_2;
  iterator __end2_1;
  iterator __begin2_1;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range2_1;
  IReporter **curr_rep_1;
  iterator __end3;
  iterator __begin3;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range3;
  TestCaseException local_50;
  reference local_30;
  IReporter **curr_rep;
  iterator __end2;
  iterator __begin2;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range2;
  string *message_local;
  
  (detail::g_cs->super_CurrentTestCaseStats).failure_flags =
       (detail::g_cs->super_CurrentTestCaseStats).failure_flags | 4;
  pvVar3 = &detail::g_cs->reporters_currently_used;
  __end2 = std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin(pvVar3);
  curr_rep = (IReporter **)
             std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end(pvVar3);
  while (bVar2 = __gnu_cxx::
                 operator==<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                           (&__end2,(__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                     *)&curr_rep), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_30 = __gnu_cxx::
               __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
               ::operator*(&__end2);
    pIVar1 = *local_30;
    in = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                   (message);
    String::String(&local_50.error_string,in);
    local_50.is_crash = true;
    (*pIVar1->_vptr_IReporter[6])(pIVar1,&local_50);
    TestCaseException::~TestCaseException(&local_50);
    __gnu_cxx::
    __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
    ::operator++(&__end2);
  }
  while (sVar4 = std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                 ::size(&detail::g_cs->subcasesStack), sVar4 != 0) {
    std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::pop_back
              (&detail::g_cs->subcasesStack);
    pvVar3 = &detail::g_cs->reporters_currently_used;
    __end3 = std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin(pvVar3)
    ;
    curr_rep_1 = (IReporter **)
                 std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                           (pvVar3);
    while (bVar2 = __gnu_cxx::
                   operator==<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                             (&__end3,(__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                       *)&curr_rep_1), ((bVar2 ^ 0xffU) & 1) != 0) {
      ppIVar5 = __gnu_cxx::
                __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                ::operator*(&__end3);
      (*(*ppIVar5)->_vptr_IReporter[8])();
      __gnu_cxx::
      __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
      ::operator++(&__end3);
    }
  }
  detail::ContextState::finalizeTestCaseData(detail::g_cs);
  pvVar3 = &detail::g_cs->reporters_currently_used;
  __end2_1 = std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin(pvVar3)
  ;
  curr_rep_2 = (IReporter **)
               std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end(pvVar3)
  ;
  while (bVar2 = __gnu_cxx::
                 operator==<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                           (&__end2_1,
                            (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                             *)&curr_rep_2), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppIVar5 = __gnu_cxx::
              __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
              ::operator*(&__end2_1);
    (*(*ppIVar5)->_vptr_IReporter[5])(*ppIVar5,&detail::g_cs->super_CurrentTestCaseStats);
    __gnu_cxx::
    __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
    ::operator++(&__end2_1);
  }
  pvVar3 = &detail::g_cs->reporters_currently_used;
  __end2_2 = std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin(pvVar3)
  ;
  curr_rep_3 = (IReporter **)
               std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end(pvVar3)
  ;
  while (bVar2 = __gnu_cxx::
                 operator==<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                           (&__end2_2,
                            (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                             *)&curr_rep_3), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppIVar5 = __gnu_cxx::
              __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
              ::operator*(&__end2_2);
    (*(*ppIVar5)->_vptr_IReporter[2])(*ppIVar5,&detail::g_cs->super_TestRunStats);
    __gnu_cxx::
    __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
    ::operator++(&__end2_2);
  }
  return;
}

Assistant:

void reportFatal(const std::string& message) {
        g_cs->failure_flags |= TestCaseFailureReason::Crash;

        DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_exception, {message.c_str(), true});

        while(g_cs->subcasesStack.size()) {
            g_cs->subcasesStack.pop_back();
            DOCTEST_ITERATE_THROUGH_REPORTERS(subcase_end, DOCTEST_EMPTY);
        }

        g_cs->finalizeTestCaseData();

        DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_end, *g_cs);

        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_end, *g_cs);
    }